

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O1

void av1_dropout_qcoeff_num
               (MACROBLOCK *mb,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,
               int dropout_num_before,int dropout_num_after)

{
  ushort uVar1;
  uint uVar2;
  uint16_t *puVar3;
  tran_low_t *ptVar4;
  int16_t *piVar5;
  uint8_t uVar6;
  uint uVar7;
  int iVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  uint eob;
  int iVar10;
  int iVar11;
  int iVar12;
  tran_low_t *qcoeff;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  uint local_58;
  
  uVar7 = (uint)CONCAT71(in_register_00000009,tx_size);
  if (((0xc < uVar7) || (iVar11 = 0x400, (0x1810U >> (uVar7 & 0x1f) & 1) == 0)) &&
     (iVar11 = 0x200, 1 < (byte)(tx_size - 0x11))) {
    iVar11 = tx_size_2d[tx_size];
  }
  puVar3 = mb->plane[plane].eobs;
  uVar1 = puVar3[block];
  uVar7 = (uint)uVar1;
  if ((dropout_num_before + dropout_num_after < iVar11 && dropout_num_before < (int)uVar7) &&
      uVar1 != 0) {
    qcoeff = mb->plane[plane].qcoeff + (block << 4);
    ptVar4 = mb->plane[plane].dqcoeff;
    piVar5 = av1_scan_orders[tx_size][tx_type].scan;
    uVar19 = 0xffffffff;
    iVar10 = 1;
    uVar9 = 0;
    eob = 0;
    iVar12 = 0;
    iVar13 = 0;
    iVar20 = 0;
    do {
      uVar2 = qcoeff[piVar5[uVar9]];
      uVar14 = -uVar2;
      if (0 < (int)uVar2) {
        uVar14 = uVar2;
      }
      iVar8 = (int)uVar9;
      if (uVar14 < 3) {
        if (uVar2 == 0) {
          if ((int)uVar19 == -1) {
            iVar20 = iVar20 + 1;
            uVar19 = 0xffffffff;
          }
          else {
            iVar13 = iVar13 + 1;
          }
        }
        else if (iVar20 < dropout_num_before) {
          eob = iVar8 + 1;
          iVar20 = 0;
        }
        else {
          if ((int)uVar19 == -1) {
            uVar19 = uVar9 & 0xffffffff;
          }
          iVar12 = iVar12 + 1;
        }
      }
      else {
        eob = iVar8 + 1;
        uVar19 = 0xffffffff;
        iVar20 = 0;
        iVar13 = 0;
      }
      if (2 < iVar12) {
        eob = iVar8 + 1;
        uVar19 = 0xffffffff;
        iVar20 = 0;
        iVar13 = 0;
        iVar12 = 0;
      }
      iVar15 = 0;
      if (uVar9 == uVar1 - 1) {
        iVar15 = iVar11 - uVar7;
      }
      iVar18 = (int)uVar19;
      if (iVar18 == -1) {
        iVar15 = 0;
      }
      iVar13 = iVar15 + iVar13;
      if (iVar13 < dropout_num_after) {
        if (uVar9 == uVar1 - 1) {
          eob = iVar8 + 1;
        }
      }
      else {
        if ((long)iVar18 <= (long)uVar9) {
          lVar16 = 0;
          do {
            lVar17 = (long)piVar5[iVar18 + lVar16];
            qcoeff[lVar17] = 0;
            ptVar4[(block << 4) + lVar17] = 0;
            lVar16 = lVar16 + 1;
          } while (iVar10 - iVar18 != (int)lVar16);
        }
        iVar20 = ((iVar20 + iVar8) - iVar18) + 1;
        iVar13 = 0;
        iVar12 = 0;
      }
      uVar9 = uVar9 + 1;
      iVar10 = iVar10 + 1;
    } while (uVar9 != uVar7);
    local_58 = (uint)uVar1;
    if (eob != local_58) {
      puVar3[block] = (uint16_t)eob;
      uVar6 = av1_get_txb_entropy_context(qcoeff,av1_scan_orders[tx_size] + tx_type,eob);
      mb->plane[plane].txb_entropy_ctx[block] = uVar6;
    }
  }
  return;
}

Assistant:

void av1_dropout_qcoeff_num(MACROBLOCK *mb, int plane, int block,
                            TX_SIZE tx_size, TX_TYPE tx_type,
                            int dropout_num_before, int dropout_num_after) {
  const struct macroblock_plane *const p = &mb->plane[plane];
  tran_low_t *const qcoeff = p->qcoeff + BLOCK_OFFSET(block);
  tran_low_t *const dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);
  const int max_eob = av1_get_max_eob(tx_size);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);

  // Early return if there are not enough non-zero coefficients.
  if (p->eobs[block] == 0 || p->eobs[block] <= dropout_num_before ||
      max_eob <= dropout_num_before + dropout_num_after) {
    return;
  }

  int count_zeros_before = 0;
  int count_zeros_after = 0;
  int count_nonzeros = 0;
  // Index of the first non-zero coefficient after sufficient number of
  // continuous zeros. If equals to `-1`, it means number of leading zeros
  // hasn't reach `dropout_num_before`.
  int idx = -1;
  int eob = 0;  // New end of block.

  for (int i = 0; i < p->eobs[block]; ++i) {
    const int scan_idx = scan_order->scan[i];
    if (abs(qcoeff[scan_idx]) > DROPOUT_COEFF_MAX) {
      // Keep large coefficients.
      count_zeros_before = 0;
      count_zeros_after = 0;
      idx = -1;
      eob = i + 1;
    } else if (qcoeff[scan_idx] == 0) {  // Count zeros.
      if (idx == -1) {
        ++count_zeros_before;
      } else {
        ++count_zeros_after;
      }
    } else {  // Count non-zeros.
      if (count_zeros_before >= dropout_num_before) {
        idx = (idx == -1) ? i : idx;
        ++count_nonzeros;
      } else {
        count_zeros_before = 0;
        eob = i + 1;
      }
    }

    // Handle continuity.
    if (count_nonzeros > DROPOUT_CONTINUITY_MAX) {
      count_zeros_before = 0;
      count_zeros_after = 0;
      count_nonzeros = 0;
      idx = -1;
      eob = i + 1;
    }

    // Handle the trailing zeros after original end of block.
    if (idx != -1 && i == p->eobs[block] - 1) {
      count_zeros_after += (max_eob - p->eobs[block]);
    }

    // Set redundant coefficients to zeros if needed.
    if (count_zeros_after >= dropout_num_after) {
      for (int j = idx; j <= i; ++j) {
        qcoeff[scan_order->scan[j]] = 0;
        dqcoeff[scan_order->scan[j]] = 0;
      }
      count_zeros_before += (i - idx + 1);
      count_zeros_after = 0;
      count_nonzeros = 0;
    } else if (i == p->eobs[block] - 1) {
      eob = i + 1;
    }
  }

  if (eob != p->eobs[block]) {
    p->eobs[block] = eob;
    p->txb_entropy_ctx[block] =
        av1_get_txb_entropy_context(qcoeff, scan_order, eob);
  }
}